

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

shared_ptr<mocker::ast::WhileStmt> __thiscall
mocker::Parser::whileStmt(Parser *this,TokIter *iter,TokIter end)

{
  long lVar1;
  TokIter iter_00;
  element_type *peVar2;
  size_t sVar3;
  size_t sVar4;
  TokenID TVar5;
  mapped_type *pmVar6;
  SyntaxError *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  shared_ptr<mocker::ast::WhileStmt> sVar8;
  Position beg;
  Position end_00;
  GetTokenID id;
  shared_ptr<mocker::ast::Statement> body;
  undefined1 local_88 [32];
  shared_ptr<mocker::ast::Expression> condition;
  Position begPos;
  __shared_ptr<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  Token::position(*end._M_current);
  begPos.line = local_88._0_8_;
  begPos.col = local_88._8_8_;
  TVar5 = GetTokenID::operator()(&id,*end._M_current);
  if (TVar5 != While) {
    (this->tokBeg)._M_current = (Token *)0x0;
    (this->tokEnd)._M_current = (Token *)0x0;
    _Var7._M_pi = extraout_RDX;
LAB_00172b5b:
    sVar8.super___shared_ptr<mocker::ast::WhileStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var7._M_pi;
    sVar8.super___shared_ptr<mocker::ast::WhileStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<mocker::ast::WhileStmt>)
           sVar8.super___shared_ptr<mocker::ast::WhileStmt,_(__gnu_cxx::_Lock_policy)2>;
  }
  lVar1 = *(long *)end._M_current;
  condition.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  condition.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  body.super___shared_ptr<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  body.super___shared_ptr<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(long *)end._M_current = lVar1 + 0x70;
  TVar5 = GetTokenID::operator()(&id,(Token *)(lVar1 + 0x38));
  if (TVar5 == LeftParen) {
    assignmentExpr((Parser *)local_88,iter,end);
    std::__shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&condition.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2> *)local_88);
    if (condition.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      iter_00._M_current = *end._M_current;
      *(Token **)end._M_current = iter_00._M_current + 1;
      TVar5 = GetTokenID::operator()(&id,iter_00);
      if (TVar5 == RightParen) {
        statement((Parser *)&local_40,iter,end);
        std::__shared_ptr<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&body.super___shared_ptr<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2>,
                   &local_40);
        peVar2 = body.super___shared_ptr<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8));
        sVar4 = begPos.col;
        sVar3 = begPos.line;
        if (peVar2 != (element_type *)0x0) {
          local_88._0_8_ =
               body.super___shared_ptr<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          pmVar6 = std::__detail::
                   _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)iter[2]._M_current,(key_type *)local_88);
          beg.col = sVar3;
          beg.line = (size_t)iter;
          end_00.col = (pmVar6->second).line;
          end_00.line = sVar4;
          makeNode<mocker::ast::WhileStmt,std::shared_ptr<mocker::ast::Expression>&,std::shared_ptr<mocker::ast::Statement>&>
                    (this,beg,end_00,(shared_ptr<mocker::ast::Expression> *)(pmVar6->second).col,
                     (shared_ptr<mocker::ast::Statement> *)
                     &condition.
                      super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&body.super___shared_ptr<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&condition.
                      super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          _Var7._M_pi = extraout_RDX_00;
          goto LAB_00172b5b;
        }
        goto LAB_00172b77;
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8));
  }
LAB_00172b77:
  this_00 = (SyntaxError *)__cxa_allocate_exception(0x48);
  Token::position(*end._M_current);
  SyntaxError::SyntaxError(this_00,&begPos,(Position *)(local_88 + 0x10));
  __cxa_throw(this_00,&SyntaxError::typeinfo,CompileError::~CompileError);
}

Assistant:

std::shared_ptr<ast::WhileStmt> Parser::whileStmt(TokIter &iter, TokIter end) {
  auto begPos = iter->position().first;
  auto id = GetTokenID(end);

  if (id(iter) != TokenID::While)
    return nullptr;
  ++iter;
  std::shared_ptr<ast::Expression> condition;
  std::shared_ptr<ast::Statement> body;
  if (id(iter++) != TokenID::LeftParen ||
      !(condition = expression(iter, end)) ||
      id(iter++) != TokenID::RightParen || !(body = statement(iter, end)))
    throw SyntaxError(begPos, iter->position().second);
  return makeNode<ast::WhileStmt>(begPos, pos[body->getID()].second, condition,
                                  body);
}